

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void __thiscall
testing::internal::GTestLog::GTestLog(GTestLog *this,GTestLogSeverity severity,char *file,int line)

{
  _Alloc_hider _Var1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  int line_00;
  char *pcVar5;
  char *pcVar6;
  string local_40;
  
  this->severity_ = severity;
  pcVar5 = "[ FATAL ]";
  if (severity == GTEST_ERROR) {
    pcVar5 = "[ ERROR ]";
  }
  pcVar2 = "[WARNING]";
  if (severity != GTEST_WARNING) {
    pcVar2 = pcVar5;
  }
  pcVar6 = "[  INFO ]";
  if (severity != GTEST_INFO) {
    pcVar6 = pcVar2;
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  line_00 = (int)pcVar5;
  std::ostream::put('H');
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  FormatFileLocation_abi_cxx11_(&local_40,(internal *)file,(char *)(ulong)(uint)line,line_00);
  _Var1._M_p = local_40._M_dataplus._M_p;
  if (local_40._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(local_40._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,_Var1._M_p,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

GTestLog::GTestLog(GTestLogSeverity severity, const char* file, int line)
    : severity_(severity) {
  const char* const marker =
      severity == GTEST_INFO ?    "[  INFO ]" :
      severity == GTEST_WARNING ? "[WARNING]" :
      severity == GTEST_ERROR ?   "[ ERROR ]" : "[ FATAL ]";
  GetStream() << ::std::endl << marker << " "
              << FormatFileLocation(file, line).c_str() << ": ";
}